

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O0

void __thiscall Date::add_day(Date *this,int n)

{
  int local_50;
  int i;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Date *pDStack_10;
  int n_local;
  Date *this_local;
  
  local_14 = n;
  pDStack_10 = this;
  if (n < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"add_day() - negative argument passed",&local_39);
    error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
    increment_day(this);
  }
  return;
}

Assistant:

void Date::add_day(int n)
{
	if (n <= 0)
		error("add_day() - negative argument passed");
	for (int i = 0; i < n; ++i)
		increment_day();
}